

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O3

int exr_set_screen_window_center(exr_context_t ctxt,int part_index,exr_attr_v2f_t *swc)

{
  long lVar1;
  long lVar2;
  exr_attribute_t *peVar3;
  int iVar4;
  exr_result_t eVar5;
  code *UNRECOVERED_JUMPTABLE;
  undefined8 uVar6;
  
  if (ctxt == (exr_context_t)0x0) {
    return 2;
  }
  if ((part_index < 0) || (*(int *)(ctxt + 0xc4) <= part_index)) {
    iVar4 = (**(code **)(ctxt + 0x48))
                      (ctxt,4,"Part index (%d) out of range",part_index,*(code **)(ctxt + 0x48));
    return iVar4;
  }
  if (*ctxt == (_priv_exr_context_t)0x3) {
    UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x38);
    uVar6 = 0x15;
  }
  else {
    if (*ctxt != (_priv_exr_context_t)0x0) {
      lVar1 = *(long *)(*(long *)(ctxt + 0x1d8) + (ulong)(uint)part_index * 8);
      lVar2 = *(long *)(lVar1 + 0x50);
      if (lVar2 == 0) {
        eVar5 = exr_attr_list_add(ctxt,(exr_attribute_list_t *)(lVar1 + 8),"screenWindowCenter",
                                  EXR_ATTR_V2F,0,(uint8_t **)0x0,(exr_attribute_t **)(lVar1 + 0x50))
        ;
        if (eVar5 != 0) {
          return eVar5;
        }
      }
      else if (*(int *)(lVar2 + 0x14) != 0x18) {
        iVar4 = (**(code **)(ctxt + 0x48))
                          (ctxt,6,"Invalid required attribute type \'%s\' for \'%s\'",
                           *(undefined8 *)(lVar2 + 8),"screenWindowCenter",*(code **)(ctxt + 0x48));
        return iVar4;
      }
      if (swc != (exr_attr_v2f_t *)0x0) {
        peVar3 = *(exr_attribute_t **)(lVar1 + 0x50);
        ((peVar3->field_6).chlist)->num_channels = (int)(swc->field_0).field_0.x;
        ((peVar3->field_6).chlist)->num_alloced = (int)(swc->field_0).field_0.y;
        return 0;
      }
      iVar4 = (**(code **)(ctxt + 0x40))(ctxt,3,"Missing value for data window assignment");
      return iVar4;
    }
    UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x38);
    uVar6 = 8;
  }
  iVar4 = (*UNRECOVERED_JUMPTABLE)(ctxt,uVar6);
  return iVar4;
}

Assistant:

exr_result_t
exr_set_screen_window_center (
    exr_context_t ctxt, int part_index, const exr_attr_v2f_t* swc)
{
    REQ_ATTR_FIND_CREATE (screenWindowCenter, EXR_ATTR_V2F);
    if (rv != EXR_ERR_SUCCESS) return EXR_UNLOCK_AND_RETURN_PCTXT (rv);
    if (!swc)
        return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->report_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Missing value for data window assignment"));

    attr->v2f->x = swc->x;
    attr->v2f->y = swc->y;
    return EXR_UNLOCK_AND_RETURN_PCTXT (rv);
}